

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::removeEdge(GraphViewer *this,int id)

{
  Connection *this_00;
  bool bVar1;
  string str;
  char buff [200];
  allocator local_129;
  string local_128;
  string local_108 [32];
  char local_e8 [208];
  
  sprintf(local_e8,"removeEdge %d\n",id);
  std::__cxx11::string::string(local_108,local_e8,&local_129);
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_128,local_108);
  bVar1 = Connection::sendMsg(this_00,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string(local_108);
  return bVar1;
}

Assistant:

bool GraphViewer::removeEdge(int id) {
	char buff[200];
	sprintf(buff, "removeEdge %d\n", id);
	string str(buff);
	return con->sendMsg(str);
}